

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsCreatePropertyId(char *name,size_t length,JsPropertyIdRef *propertyId)

{
  char16_t *pcVar1;
  size_t cPropertyNameLength;
  undefined1 local_48 [8];
  NarrowToWide wname;
  JsPropertyIdRef *propertyId_local;
  size_t length_local;
  char *name_local;
  
  if (name == (char *)0x0) {
    name_local._4_4_ = JsErrorNullArgument;
  }
  else {
    wname._24_8_ = propertyId;
    length_local = (size_t)name;
    utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
    NarrowWideConverter((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                         *)local_48,(char **)&length_local,length);
    pcVar1 = utf8::NarrowWideConverter::operator_cast_to_char16_t_((NarrowWideConverter *)local_48);
    if (pcVar1 == (char16_t *)0x0) {
      name_local._4_4_ = JsErrorOutOfMemory;
    }
    else {
      pcVar1 = utf8::NarrowWideConverter::operator_cast_to_char16_t_
                         ((NarrowWideConverter *)local_48);
      cPropertyNameLength =
           utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
           ::Length((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                     *)local_48);
      name_local._4_4_ =
           JsGetPropertyIdFromNameInternal
                     (pcVar1,cPropertyNameLength,(JsPropertyIdRef *)wname._24_8_);
    }
    utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
    ~NarrowWideConverter
              ((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                *)local_48);
  }
  return name_local._4_4_;
}

Assistant:

CHAKRA_API JsCreatePropertyId(
    _In_z_ const char *name,
    _In_ size_t length,
    _Out_ JsPropertyIdRef *propertyId)
{
    PARAM_NOT_NULL(name);
    utf8::NarrowToWide wname(name, length);
    if (!wname)
    {
        return JsErrorOutOfMemory;
    }

    return JsGetPropertyIdFromNameInternal(wname, wname.Length(), propertyId);
}